

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QModelIndex * __thiscall QTreeView::indexAbove(QTreeView *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  const_reference pQVar3;
  QModelIndex *in_RDX;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *in_stack_00000008;
  QTreeViewPrivate *in_stack_00000010;
  int i;
  QTreeViewPrivate *d;
  QModelIndex firstColumnIndex;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QAbstractItemViewPrivate *index_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 *local_20;
  undefined1 *local_18;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  index_00 = in_RDI;
  d_func((QTreeView *)0x8fa324);
  bVar1 = QAbstractItemViewPrivate::isIndexValid
                    ((QAbstractItemViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (QModelIndex *)index_00);
  if (bVar1) {
    QAbstractItemViewPrivate::executePostedLayout(in_RDI);
    iVar2 = QTreeViewPrivate::viewIndex(in_stack_00000010,in_stack_00000008);
    iVar2 = iVar2 + -1;
    if (iVar2 < 0) {
      QModelIndex::QModelIndex((QModelIndex *)0x8fa382);
    }
    else {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)in_RDI,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_20._0_4_ = (pQVar3->index).r;
      local_20._4_4_ = (pQVar3->index).c;
      local_18 = (undefined1 *)(pQVar3->index).i;
      local_10.ptr = (pQVar3->index).m.ptr;
      QModelIndex::row((QModelIndex *)&local_20);
      QModelIndex::column(in_RDX);
      QModelIndex::sibling
                ((QModelIndex *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 (int)((ulong)index_00 >> 0x20),(int)index_00);
    }
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x8fa346);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QModelIndex *)index_00;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTreeView::indexAbove(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    if (!d->isIndexValid(index))
        return QModelIndex();
    d->executePostedLayout();
    int i = d->viewIndex(index);
    if (--i < 0)
        return QModelIndex();
    const QModelIndex firstColumnIndex = d->viewItems.at(i).index;
    return firstColumnIndex.sibling(firstColumnIndex.row(), index.column());
}